

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# methodarea.cpp
# Opt level: O0

bool __thiscall MethodArea::addClass(MethodArea *this,ClassRuntime *classRuntime)

{
  ClassFile *pCVar1;
  char *pcVar2;
  size_type sVar3;
  mapped_type *ppCVar4;
  allocator local_89;
  string local_88 [55];
  allocator local_51;
  string local_50 [32];
  char *local_30;
  char *key;
  ClassFile *classFile;
  ClassRuntime *classRuntime_local;
  MethodArea *this_local;
  
  classFile = (ClassFile *)classRuntime;
  classRuntime_local = (ClassRuntime *)this;
  key = (char *)ClassRuntime::getClassFile(classRuntime);
  pcVar2 = getFormattedConstant(((ClassFile *)key)->constant_pool,((ClassFile *)key)->this_class);
  local_30 = pcVar2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_50,pcVar2,&local_51);
  sVar3 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ClassRuntime_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ClassRuntime_*>_>_>
          ::count(&this->_classes,(key_type *)local_50);
  std::__cxx11::string::~string(local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  pCVar1 = classFile;
  pcVar2 = local_30;
  if (sVar3 == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_88,pcVar2,&local_89);
    ppCVar4 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ClassRuntime_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ClassRuntime_*>_>_>
              ::operator[](&this->_classes,(key_type *)local_88);
    *ppCVar4 = (mapped_type)pCVar1;
    std::__cxx11::string::~string(local_88);
    std::allocator<char>::~allocator((allocator<char> *)&local_89);
  }
  return sVar3 == 0;
}

Assistant:

bool MethodArea::addClass(ClassRuntime *classRuntime) {
    ClassFile *classFile = classRuntime->getClassFile();
    
    const char *key = getFormattedConstant(classFile->constant_pool, classFile->this_class);
    
    if (_classes.count(key) > 0) {
        return false;
    }
    
    _classes[key] = classRuntime;
    return true;
}